

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> _Var2;
  _func_int **pp_Var3;
  Enum EVar4;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_70;
  Token local_68;
  
  RVar1 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_68,this);
  _Var2._M_head_impl = (ExportModuleField *)operator_new(0xb0);
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
  filename._M_len = local_68.loc.filename._M_len;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
  filename._M_str = local_68.loc.filename._M_str;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
  field_1.field_1.offset = (size_t)local_68.loc.field_1.field_1.offset;
  *(undefined8 *)
   ((long)&((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).
           super_ModuleField.loc.field_1 + 8) = local_68.loc.field_1._8_8_;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.type_ =
       Export;
  ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
  _vptr_ModuleField = (_func_int **)&PTR__ExportModuleField_00190840;
  ((_Var2._M_head_impl)->export_).name._M_dataplus._M_p =
       (pointer)&((_Var2._M_head_impl)->export_).name.field_2;
  ((_Var2._M_head_impl)->export_).name._M_string_length = 0;
  ((_Var2._M_head_impl)->export_).name.field_2._M_local_buf[0] = '\0';
  Var::Var(&((_Var2._M_head_impl)->export_).var);
  RVar1 = Expect(this,Export);
  if (RVar1.enum_ != Error) {
    RVar1 = ParseQuotedText(this,&((_Var2._M_head_impl)->export_).name,true);
    if (((RVar1.enum_ != Error) &&
        (RVar1 = ParseExportDesc(this,&(_Var2._M_head_impl)->export_), RVar1.enum_ != Error)) &&
       (RVar1 = Expect(this,Rpar), RVar1.enum_ != Error)) {
      local_70._M_head_impl = _Var2._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                                  *)&local_70);
      EVar4 = Ok;
      if (local_70._M_head_impl == (ExportModuleField *)0x0) {
        return (Result)Ok;
      }
      pp_Var3 = ((local_70._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).
                super_ModuleField._vptr_ModuleField;
      _Var2._M_head_impl = local_70._M_head_impl;
      goto LAB_00132602;
    }
  }
  pp_Var3 = ((_Var2._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).
            super_ModuleField._vptr_ModuleField;
LAB_00132602:
  (*pp_Var3[1])(_Var2._M_head_impl);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseExportModuleField(Module* module) {
  WABT_TRACE(ParseExportModuleField);
  EXPECT(Lpar);
  auto field = std::make_unique<ExportModuleField>(GetLocation());
  EXPECT(Export);
  CHECK_RESULT(ParseQuotedText(&field->export_.name));
  CHECK_RESULT(ParseExportDesc(&field->export_));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}